

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void nh_ws_recv_handler(ws_session_t *session)

{
  int iVar1;
  ws_context_t *__dest;
  ws_context_t *local_78 [3];
  undefined1 auStack_60 [40];
  undefined4 local_38;
  ws_context_t *local_30;
  ws_context_t *ctx;
  nh_stream_t stream;
  ws_session_t *session_local;
  
  if ((session->flags & 2) == 0) {
    stream._16_8_ = session;
    memset(&ctx,0,0x18);
    iVar1 = nh_read_socket((nh_stream_t *)&ctx,*(int *)(stream._16_8_ + 0x18));
    if (iVar1 == 0) {
      if (*(long *)(*(long *)(stream._16_8_ + 0x40) + 0x18) != 0) {
        (**(code **)(*(long *)(stream._16_8_ + 0x40) + 0x18))(stream._16_8_);
      }
      nh_ws_session_free((ws_session_t *)stream._16_8_);
    }
    else {
      if ((*(long *)(stream._16_8_ + 0x48) == 0) ||
         (*(int *)(*(long *)(stream._16_8_ + 0x48) + 0x40) == 2)) {
        __dest = (ws_context_t *)calloc(1,0x48);
        local_78[0] = ctx;
        local_78[2] = (ws_context_t *)stream._8_8_;
        local_30 = __dest;
        memset(auStack_60,0,0x28);
        local_38 = 0;
        memcpy(__dest,local_78,0x48);
      }
      else {
        local_30 = *(ws_context_t **)(stream._16_8_ + 0x48);
        nh_stream_copy(&local_30->stream,(char *)ctx,stream.buf._4_4_);
      }
      nh_ws_parse(local_30);
      if (local_30->parse_state == PARSE_WS_DONE) {
        *(undefined8 *)(stream._16_8_ + 0x48) = 0;
        switch((local_30->frame).opcode) {
        case '\x01':
        case '\x02':
          if (*(long *)(*(long *)(stream._16_8_ + 0x40) + 8) != 0) {
            (**(code **)(*(long *)(stream._16_8_ + 0x40) + 8))(local_30,stream._16_8_);
          }
          break;
        case '\b':
          if (*(long *)(*(long *)(stream._16_8_ + 0x40) + 0x10) != 0) {
            (**(code **)(*(long *)(stream._16_8_ + 0x40) + 0x10))(stream._16_8_);
          }
          nh_ws_on_close_handler(local_30,(ws_session_t *)stream._16_8_);
          return;
        case '\t':
          nh_ws_on_ping_handler(local_30,(ws_session_t *)stream._16_8_);
        case '\0':
        case '\n':
        default:
        }
        *(undefined2 *)(stream._16_8_ + 0x28) = 0x78;
      }
      else {
        *(ws_context_t **)(stream._16_8_ + 0x48) = local_30;
      }
    }
  }
  return;
}

Assistant:

void nh_ws_recv_handler(ws_session_t *session) {
    // check is closed
    if (FLAG_CHECK(session->flags, WEBSOCKET_SESSION_CLOSE)) return;

    nh_stream_t stream = {0};
    if (nh_read_socket(&stream, session->socket) == 0) {
        CALL_SESSION_CALLBACK(session->ws_handlers->on_closed, session);
        nh_ws_session_free(session);
        return;
    }
    ws_context_t *ctx;
    if (session->incomplete_recv != NULL && session->incomplete_recv->parse_state != PARSE_WS_DONE) {
        ctx = session->incomplete_recv;
        nh_stream_copy(&ctx->stream, stream.buf, stream.length);
    } else {
        ctx = calloc(1, sizeof(ws_context_t));
        *ctx = (ws_context_t) {
            .stream = stream,
        };
    }
    // parse
    nh_ws_parse(ctx);
    if (ctx->parse_state != PARSE_WS_DONE) {
        session->incomplete_recv = ctx;
        return;
    }
    session->incomplete_recv = NULL;
    // handle
    // DO NOT SUPPORT FIN == 0 && OPCODE == %x0
    switch (ctx->frame.opcode) {
        case WEBSOCKET_OP_TEXT:
        case WEBSOCKET_OP_BIN:
            CALL_CONTEXT_CALLBACK(session->ws_handlers->on_message, ctx, session);
            break;
        case WEBSOCKET_OP_CLOSE:
            // on_close callback
            CALL_SESSION_CALLBACK(session->ws_handlers->on_close, session);
            nh_ws_on_close_handler(ctx, session);
            return;
        case WEBSOCKET_OP_PING:
            nh_ws_on_ping_handler(ctx, session);
        case WEBSOCKET_OP_PONG:
        case WEBSOCKET_OP_CONTINUE:
        default:
            break;
    }
    session->timeout = WEBSOCKET_TIMEOUT;
}